

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O3

void __thiscall FSerializer::WriteObjects(FSerializer *this)

{
  DObject *this_00;
  int iVar1;
  FWriter *pFVar2;
  undefined4 extraout_var;
  ulong uVar4;
  PClass *pPVar3;
  
  if ((this->w != (FWriter *)0x0) && ((this->w->mDObjects).Count != 0)) {
    BeginArray(this,"objects");
    pFVar2 = this->w;
    if ((pFVar2->mDObjects).Count != 0) {
      uVar4 = 0;
      do {
        this_00 = (pFVar2->mDObjects).Array[uVar4];
        BeginObject(this,(char *)0x0);
        FWriter::Key(this->w,"classtype");
        pFVar2 = this->w;
        pPVar3 = this_00->Class;
        if (pPVar3 == (PClass *)0x0) {
          iVar1 = (**this_00->_vptr_DObject)(this_00);
          pPVar3 = (PClass *)CONCAT44(extraout_var,iVar1);
          this_00->Class = pPVar3;
        }
        FWriter::String(pFVar2,FName::NameData.NameArray
                               [(pPVar3->super_PNativeStruct).super_PStruct.super_PNamedType.
                                TypeName.Index].Text);
        DObject::SerializeUserVars(this_00,this);
        (*this_00->_vptr_DObject[3])(this_00);
        DObject::CheckIfSerialized(this_00);
        EndObject(this);
        uVar4 = uVar4 + 1;
        pFVar2 = this->w;
      } while (uVar4 < (pFVar2->mDObjects).Count);
    }
    EndArray(this);
    return;
  }
  return;
}

Assistant:

bool isWriting() const
	{
		return w != nullptr;
	}